

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

ON_NurbsSurface * __thiscall
ON_NurbsCage::IsoSurface(ON_NurbsCage *this,int dir,double c,ON_NurbsSurface *srf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  ON_NurbsSurface *this_00;
  int iVar9;
  char *sFormat;
  int iVar10;
  double *pdVar11;
  int iVar12;
  int cage_ijk [3];
  ON_NurbsCurve nurbs_curve;
  int local_bc [3];
  long local_b0;
  long local_a8;
  int *local_a0;
  int local_94;
  double local_90;
  int *local_88;
  ON_NurbsSurface *local_80;
  ulong local_78;
  ON_NurbsCurve local_70;
  
  local_90 = c;
  if ((uint)dir < 3) {
    uVar4 = (ulong)(uint)dir;
    iVar7 = this->m_order[uVar4];
    if (((1 < iVar7) && (iVar7 <= this->m_cv_count[uVar4])) &&
       (this->m_knot[uVar4] != (double *)0x0)) {
      iVar12 = (uint)(byte)(0 < this->m_dim & this->m_is_rat) + this->m_dim;
      iVar7 = ON_NurbsSpanIndex(iVar7,this->m_cv_count[uVar4],this->m_knot[uVar4],c,0,0);
      ON_NurbsCurve::ON_NurbsCurve(&local_70);
      local_70.m_dim =
           (this->m_cv_count[0] * iVar12 * this->m_cv_count[1] * this->m_cv_count[2]) /
           this->m_cv_count[uVar4];
      local_70.m_is_rat = 0;
      local_70.m_order = this->m_order[uVar4];
      local_70.m_cv_count = local_70.m_order;
      ON_NurbsCurve::ReserveCVCapacity(&local_70,local_70.m_order * local_70.m_dim);
      local_70.m_cv_stride = local_70.m_dim;
      ON_NurbsCurve::ManageKnotForExperts(&local_70,0,this->m_knot[uVar4] + iVar7);
      local_a0 = local_bc + 1;
      local_88 = local_bc + 2;
      if (dir == 0) {
        local_a8 = 2;
        local_b0 = 1;
      }
      else if (dir == 1) {
        local_a8 = 2;
        local_a0 = local_bc;
        local_b0 = 0;
      }
      else {
        local_88 = local_bc + 1;
        local_a0 = local_bc;
        local_a8 = 1;
        local_b0 = 0;
      }
      iVar1 = this->m_order[uVar4];
      local_80 = srf;
      local_78 = uVar4;
      if (0 < iVar1) {
        iVar2 = this->m_cv_count[local_b0];
        iVar3 = this->m_cv_count[local_a8];
        iVar9 = iVar7;
        do {
          pdVar8 = ON_NurbsCurve::CV(&local_70,iVar9 - iVar7);
          local_94 = iVar9;
          local_bc[local_78] = iVar9;
          if (0 < iVar2) {
            iVar9 = 0;
            do {
              *local_a0 = iVar9;
              if (0 < iVar3) {
                iVar10 = 0;
                do {
                  *local_88 = iVar10;
                  if (this->m_cv == (double *)0x0) {
                    pdVar11 = (double *)0x0;
                  }
                  else {
                    pdVar11 = this->m_cv +
                              (long)this->m_cv_stride[0] * (long)local_bc[0] +
                              (long)this->m_cv_stride[1] * (long)local_bc[1] +
                              (long)this->m_cv_stride[2] * (long)local_bc[2];
                  }
                  memcpy(pdVar8,pdVar11,(long)(iVar12 * 8));
                  iVar10 = iVar10 + 1;
                  pdVar8 = pdVar8 + iVar12;
                } while (iVar3 != iVar10);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != iVar2);
          }
          iVar9 = local_94 + 1;
        } while (iVar9 < iVar1 + iVar7);
      }
      lVar6 = local_a8;
      lVar5 = local_b0;
      this_00 = local_80;
      if (local_80 == (ON_NurbsSurface *)0x0) {
        this_00 = ON_NurbsSurface::New();
      }
      ON_NurbsSurface::Create
                (this_00,this->m_dim,this->m_is_rat,this->m_order[lVar5],this->m_order[lVar6],
                 this->m_cv_count[lVar5],this->m_cv_count[lVar6]);
      ON_NurbsCurve::Evaluate(&local_70,local_90,0,local_70.m_dim,this_00->m_cv,0,(int *)0x0);
      local_70.m_knot = (double *)0x0;
      pdVar8 = this_00->m_knot[0];
      pdVar11 = this->m_knot[lVar5];
      iVar7 = ON_NurbsSurface::KnotCount(this_00,0);
      memcpy(pdVar8,pdVar11,(long)iVar7 << 3);
      pdVar8 = this_00->m_knot[1];
      pdVar11 = this->m_knot[lVar6];
      iVar7 = ON_NurbsSurface::KnotCount(this_00,1);
      memcpy(pdVar8,pdVar11,(long)iVar7 << 3);
      ON_NurbsCurve::~ON_NurbsCurve(&local_70);
      return this_00;
    }
    sFormat = "ON_NurbsCage::IsoSurface - invalid NURBS cage";
    iVar7 = 0x547;
  }
  else {
    sFormat = "ON_NurbsCage::IsoSurface - invalid dir parameter";
    iVar7 = 0x542;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
             ,iVar7,"",sFormat);
  return (ON_NurbsSurface *)0x0;
}

Assistant:

ON_NurbsSurface* ON_NurbsCage::IsoSurface(
        int dir,
        double c,
        ON_NurbsSurface* srf
        ) const
{
  // c = 0; cage(c,s,t) = srf(s,t)
  // c = 1; cage(r,c,t) = srf(r,t)
  // c = 2; cage(r,s,c) = srf(r,s)
  if ( dir < 0 || dir > 2 )
  {
    ON_ERROR("ON_NurbsCage::IsoSurface - invalid dir parameter");
    return 0;
  }
  if ( m_order[dir] < 2 || m_cv_count[dir] < m_order[dir] || 0 == m_knot[dir] )
  {
    ON_ERROR("ON_NurbsCage::IsoSurface - invalid NURBS cage");
    return 0;
  }

  const int cage_cvdim = CVSize();

  int span_index = ON_NurbsSpanIndex(m_order[dir],m_cv_count[dir],m_knot[dir],c,0,0);
  ON_NurbsCurve nurbs_curve;
  nurbs_curve.m_dim = cage_cvdim*m_cv_count[0]*m_cv_count[1]*m_cv_count[2]/m_cv_count[dir];
  nurbs_curve.m_is_rat = 0;
  nurbs_curve.m_order = m_order[dir];
  nurbs_curve.m_cv_count = nurbs_curve.m_order;
  nurbs_curve.ReserveCVCapacity(nurbs_curve.m_dim*nurbs_curve.m_cv_count);
  nurbs_curve.m_cv_stride = nurbs_curve.m_dim;
  // nurbs_curve.m_knot[] shares memory with m_knot[dir] + span_index. nurbs_curve destructor does not free nurbs_curve.m_knot[]
  nurbs_curve.ManageKnotForExperts(0, m_knot[dir] + span_index);

  int ii,jj,kk;
  /*
  int i0 = 0;
  int i1 = m_cv_count[0];
  int j0 = 0;
  int j1 = m_cv_count[1];
  int k0 = 0;
  int k1 = m_cv_count[2];
  */

  //int i0 = span_index;
  //int i1 = span_index+m_order[dir];
  ii = dir;
  switch(dir)
  {
  case 0:
    jj = 1;
    kk = 2;
    break;
  case 1:
    jj = 0;
    kk = 2;
    break;
  case 2:
    jj = 0;
    kk = 1;
    break;
  default: // to keep lint happy
    ii = 0;
    jj = 1;
    kk = 2;
    break;
  };


  double* cv;
  const int cage_sizeofcv = cage_cvdim*sizeof(*cv);
  //int i0 = span_index;
  int i1 = span_index+m_order[ii];
  int j1 = m_cv_count[jj];
  int k1 = m_cv_count[kk];

  int i,j,k;
  int cage_ijk[3];
  for ( i = span_index; i < i1; i++) 
  {
    cv = nurbs_curve.CV(i-span_index);
    cage_ijk[ii] = i;
    for ( j = 0; j < j1; j++ ) 
    {
      cage_ijk[jj] = j;
      for ( k = 0; k < k1; k++ )
      {
        cage_ijk[kk] = k;
        memcpy(cv,CV(cage_ijk[0],cage_ijk[1],cage_ijk[2]),cage_sizeofcv);
        cv += cage_cvdim;
      }
    }
  }

  ON_NurbsSurface* iso_srf = srf ? srf : ON_NurbsSurface::New();
  iso_srf->Create(m_dim,m_is_rat,m_order[jj],m_order[kk],m_cv_count[jj],m_cv_count[kk]);
  nurbs_curve.Evaluate(c,0,nurbs_curve.m_dim,iso_srf->m_cv,0,0);
  nurbs_curve.m_knot = 0;
  memcpy(iso_srf->m_knot[0],m_knot[jj],iso_srf->KnotCount(0)*sizeof(*iso_srf->m_knot[0]));
  memcpy(iso_srf->m_knot[1],m_knot[kk],iso_srf->KnotCount(1)*sizeof(*iso_srf->m_knot[1]));

  return iso_srf;
}